

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_42055d::LocalName::printLeft(LocalName *this,OutputStream *S)

{
  Node *pNVar1;
  char *pcVar2;
  size_t sVar3;
  
  pNVar1 = this->Encoding;
  (*pNVar1->_vptr_Node[4])(pNVar1);
  if (pNVar1->RHSComponentCache != No) {
    (*pNVar1->_vptr_Node[5])(pNVar1,S);
  }
  OutputStream::grow(S,2);
  pcVar2 = S->Buffer;
  sVar3 = S->CurrentPosition;
  (pcVar2 + sVar3)[0] = ':';
  (pcVar2 + sVar3)[1] = ':';
  S->CurrentPosition = S->CurrentPosition + 2;
  pNVar1 = this->Entity;
  (*pNVar1->_vptr_Node[4])(pNVar1,S);
  if (pNVar1->RHSComponentCache == No) {
    return;
  }
  (*pNVar1->_vptr_Node[5])(pNVar1,S);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    Encoding->print(S);
    S += "::";
    Entity->print(S);
  }